

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_775ed::Pools::~Pools(Pools *this)

{
  pointer ppvVar1;
  bool bVar2;
  ulong uVar3;
  pointer ppuVar4;
  ulong uVar5;
  pointer ppuVar6;
  
  ppuVar6 = (this->chunks_).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppuVar4 = (this->chunks_).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppuVar4 != ppuVar6) {
    uVar3 = 0;
    uVar5 = 1;
    do {
      if (ppuVar6[uVar3] != (uchar *)0x0) {
        operator_delete__(ppuVar6[uVar3]);
        ppuVar6 = (this->chunks_).
                  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppuVar4 = (this->chunks_).
                  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      bVar2 = uVar5 < (ulong)((long)ppuVar4 - (long)ppuVar6 >> 3);
      uVar3 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  if (ppuVar6 != (pointer)0x0) {
    operator_delete(ppuVar6);
  }
  ppvVar1 = (this->pools_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppvVar1 != (pointer)0x0) {
    operator_delete(ppvVar1);
    return;
  }
  return;
}

Assistant:

~Pools() {
            for(index_t i=0; i<chunks_.size(); ++i) {
                delete[] chunks_[i];
            }
        }